

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

int glslang::TIntermediate::getBaseAlignmentScalar(TType *type,int *size)

{
  int iVar1;
  uint uVar2;
  int *size_local;
  TType *type_local;
  
  iVar1 = (*type->_vptr_TType[7])();
  switch(iVar1) {
  case 2:
  case 10:
  case 0xb:
    *size = 8;
    type_local._4_4_ = 8;
    break;
  case 3:
    *size = 2;
    type_local._4_4_ = 2;
    break;
  case 4:
  case 5:
    *size = 1;
    type_local._4_4_ = 1;
    break;
  case 6:
  case 7:
    *size = 2;
    type_local._4_4_ = 2;
    break;
  default:
    *size = 4;
    type_local._4_4_ = 4;
    break;
  case 0xe:
    uVar2 = (*type->_vptr_TType[0x2e])();
    if (((uVar2 & 1) == 0) && (uVar2 = (*type->_vptr_TType[0x2f])(), (uVar2 & 1) == 0)) {
      *size = 4;
      type_local._4_4_ = 4;
    }
    else {
      *size = 8;
      type_local._4_4_ = 8;
    }
    break;
  case 0x12:
    *size = 8;
    type_local._4_4_ = 8;
  }
  return type_local._4_4_;
}

Assistant:

int TIntermediate::getBaseAlignmentScalar(const TType& type, int& size)
{
    switch (type.getBasicType()) {
    case EbtInt64:
    case EbtUint64:
    case EbtDouble:  size = 8; return 8;
    case EbtFloat16: size = 2; return 2;
    case EbtInt8:
    case EbtUint8:   size = 1; return 1;
    case EbtInt16:
    case EbtUint16:  size = 2; return 2;
    case EbtReference: size = 8; return 8;
    case EbtSampler:
    {
        if (type.isBindlessImage() || type.isBindlessTexture()) {
            size = 8; return 8;
        }
        else {
            size = 4; return 4;
        }
    }
    default:         size = 4; return 4;
    }
}